

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(ostream *os,string *s)

{
  char cVar1;
  bool bVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_30;
  char c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *s_local;
  ostream *os_local;
  
  std::operator<<(os,'\"');
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_30._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffffd0), bVar2) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    cVar1 = *pcVar3;
    if (cVar1 == '\\') {
      std::operator<<(os,"\\\\");
    }
    else if (cVar1 == '\"') {
      std::operator<<(os,"\\\"");
    }
    else {
      std::operator<<(os,cVar1);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  std::operator<<(os,'\"');
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteCMakeArgument(std::ostream& os,
                                                       const std::string& s)
{
  // Write the given string to the stream with escaping to get it back
  // into CMake through the lexical scanner.
  os << '"';
  for (char c : s) {
    if (c == '\\') {
      os << "\\\\";
    } else if (c == '"') {
      os << "\\\"";
    } else {
      os << c;
    }
  }
  os << '"';
}